

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::ArrayBuilder<kj::ArrayPtr<const_unsigned_char>_>::dispose
          (ArrayBuilder<kj::ArrayPtr<const_unsigned_char>_> *this)

{
  ArrayPtr<const_unsigned_char> *firstElement;
  RemoveConst<kj::ArrayPtr<const_unsigned_char>_> *pRVar1;
  ArrayPtr<const_unsigned_char> *pAVar2;
  ArrayPtr<const_unsigned_char> *endCopy;
  ArrayPtr<const_unsigned_char> *posCopy;
  ArrayPtr<const_unsigned_char> *ptrCopy;
  ArrayBuilder<kj::ArrayPtr<const_unsigned_char>_> *this_local;
  
  firstElement = this->ptr;
  pRVar1 = this->pos;
  pAVar2 = this->endPtr;
  if (firstElement != (ArrayPtr<const_unsigned_char> *)0x0) {
    this->ptr = (ArrayPtr<const_unsigned_char> *)0x0;
    this->pos = (RemoveConst<kj::ArrayPtr<const_unsigned_char>_> *)0x0;
    this->endPtr = (ArrayPtr<const_unsigned_char> *)0x0;
    ArrayDisposer::dispose<kj::ArrayPtr<unsigned_char_const>>
              (this->disposer,firstElement,(long)pRVar1 - (long)firstElement >> 4,
               (long)pAVar2 - (long)firstElement >> 4);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }